

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

size_t Path::find_last_slash(string *str)

{
  size_t sVar1;
  size_type index;
  string *str_local;
  
  sVar1 = std::__cxx11::string::find_last_of((char)str,0x2f);
  return sVar1;
}

Assistant:

static size_t find_last_slash(const string &str)
{
#ifdef _WIN32
	auto index = str.find_last_of("/\\");
#else
	auto index = str.find_last_of('/');
#endif
	return index;
}